

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFabUtil.cpp
# Opt level: O2

void amrex::average_node_to_cellcenter
               (MultiFab *cc,int dcomp,MultiFab *nd,int scomp,int ncomp,int ngrow)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long local_1b8;
  long local_1b0;
  Box bx;
  Array4<const_double> local_110;
  Array4<double> local_d0;
  MFIter mfi;
  
  uVar8 = (ulong)(uint)ncomp;
  MFIter::MFIter(&mfi,(FabArrayBase *)cc,true);
  if (ncomp < 1) {
    uVar8 = 0;
  }
  while (mfi.currentIndex < mfi.endIndex) {
    MFIter::growntilebox(&bx,&mfi,ngrow);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_d0,&cc->super_FabArray<amrex::FArrayBox>,&mfi);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_110,&nd->super_FabArray<amrex::FArrayBox>,&mfi);
    lVar6 = (long)bx.smallend.vect[0] * 8;
    local_1b8 = (long)scomp << 3;
    local_1b0 = (long)dcomp << 3;
    for (uVar4 = 0; lVar13 = (long)bx.smallend.vect[2], iVar5 = bx.smallend.vect[2], uVar4 != uVar8;
        uVar4 = uVar4 + 1) {
      while (iVar5 = iVar5 + 1, (int)lVar13 <= bx.bigend.vect[2]) {
        lVar1 = lVar13 + 1;
        lVar9 = (long)(iVar5 - local_110.begin.z) * local_110.kstride * 8 +
                local_110.nstride * local_1b8 + (long)local_110.begin.x * -8;
        lVar7 = (lVar13 - local_110.begin.z) * local_110.kstride * 8 + local_110.nstride * local_1b8
                + (long)local_110.begin.x * -8;
        lVar12 = lVar13 - local_d0.begin.z;
        lVar14 = (long)bx.smallend.vect[1];
        while (lVar13 = lVar1, lVar14 <= bx.bigend.vect[1]) {
          if (bx.bigend.vect[0] < bx.smallend.vect[0]) {
            lVar14 = lVar14 + 1;
          }
          else {
            lVar13 = lVar14 + 1;
            lVar15 = lVar14 - local_d0.begin.y;
            lVar16 = (lVar14 - local_110.begin.y) * local_110.jstride * 8;
            lVar2 = lVar16 + lVar9 + lVar6 + 8;
            lVar16 = lVar16 + lVar7 + lVar6 + 8;
            lVar11 = (long)((int)lVar13 - local_110.begin.y) * local_110.jstride * 8;
            lVar3 = lVar11 + lVar9 + lVar6;
            lVar11 = lVar11 + lVar7 + lVar6;
            lVar10 = 0;
            do {
              *(double *)
               ((long)local_d0.p +
               lVar10 * 8 +
               lVar15 * local_d0.jstride * 8 +
               local_d0.nstride * local_1b0 + lVar12 * local_d0.kstride * 8 +
               (long)local_d0.begin.x * -8 + lVar6) =
                   (*(double *)((long)local_110.p + lVar10 * 8 + lVar16 + -8) +
                    *(double *)((long)local_110.p + lVar10 * 8 + lVar16) +
                    *(double *)((long)local_110.p + lVar10 * 8 + lVar11) +
                    *(double *)((long)local_110.p + lVar10 * 8 + lVar11 + 8) +
                    *(double *)((long)local_110.p + lVar10 * 8 + lVar2 + -8) +
                    *(double *)((long)local_110.p + lVar10 * 8 + lVar2) +
                    *(double *)((long)local_110.p + lVar10 * 8 + lVar3) +
                   *(double *)((long)local_110.p + lVar10 * 8 + lVar3 + 8)) * 0.125;
              lVar10 = lVar10 + 1;
              lVar14 = lVar13;
            } while ((bx.bigend.vect[0] - bx.smallend.vect[0]) + 1 != (int)lVar10);
          }
        }
      }
      local_1b8 = local_1b8 + 8;
      local_1b0 = local_1b0 + 8;
    }
    MFIter::operator++(&mfi);
  }
  MFIter::~MFIter(&mfi);
  return;
}

Assistant:

void average_node_to_cellcenter (MultiFab& cc, int dcomp,
         const MultiFab& nd, int scomp, int ncomp, int ngrow)
    {
#ifdef AMREX_USE_GPU
        if (Gpu::inLaunchRegion() && cc.isFusingCandidate()) {
            auto const& ccma = cc.arrays();
            auto const& ndma = nd.const_arrays();
            ParallelFor(cc, IntVect(ngrow), ncomp,
            [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
            {
                amrex_avg_nd_to_cc(i, j, k, n, ccma[box_no], ndma[box_no], dcomp, scomp);
            });
            Gpu::streamSynchronize();
        } else
#endif
        {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(cc,TilingIfNotGPU()); mfi.isValid(); ++mfi)
            {
                const Box bx = mfi.growntilebox(ngrow);
                Array4<Real> const& ccarr = cc.array(mfi);
                Array4<Real const> const& ndarr = nd.const_array(mfi);

                AMREX_HOST_DEVICE_PARALLEL_FOR_4D( bx, ncomp, i, j, k, n,
                {
                    amrex_avg_nd_to_cc(i, j, k, n, ccarr, ndarr, dcomp, scomp);
                });
            }
        }
    }